

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_bounding_box.cpp
# Opt level: O2

bool __thiscall ON_BoundingBox::IsSet(ON_BoundingBox *this)

{
  double dVar1;
  
  if ((((ABS((this->m_min).x) < 1.23432101234321e+308) &&
       (ABS((this->m_max).x) < 1.23432101234321e+308)) &&
      (ABS((this->m_min).y) < 1.23432101234321e+308)) &&
     (((ABS((this->m_max).y) < 1.23432101234321e+308 &&
       (ABS((this->m_min).z) < 1.23432101234321e+308)) &&
      (dVar1 = (this->m_max).z, -1.23432101234321e+308 < dVar1)))) {
    return dVar1 < 1.23432101234321e+308;
  }
  return false;
}

Assistant:

bool ON_BoundingBox::IsSet() const
{
	return ( ON_IS_VALID(m_min.x)
          && ON_IS_VALID(m_max.x)
          && ON_IS_VALID(m_min.y)
          && ON_IS_VALID(m_max.y)
          && ON_IS_VALID(m_min.z)
          && ON_IS_VALID(m_max.z)
         );
}